

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall kratos::VarVarSlice::VarVarSlice(VarVarSlice *this,Var *parent,Var *slice)

{
  Var **var;
  pointer puVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  VarException *pVVar2;
  bool bVar3;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  Var *pVVar7;
  uint64_t uVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar9;
  format_args args;
  string_view format_str;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_b0;
  Var *local_a8;
  string local_a0;
  ulong local_80;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  ulong local_58;
  VarException *local_40;
  allocator_type local_31;
  
  VarSlice::VarSlice(&this->super_VarSlice,parent,0,0);
  (this->super_VarSlice).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_00577510;
  this->sliced_var_ = slice;
  puVar1 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((((long)(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 == 4) && (*puVar1 == 1)) &&
     (parent->explicit_array_ == false)) {
    (this->super_VarSlice).super_Var.var_width_ = 1;
    local_78._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,1);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)
               &(this->super_VarSlice).super_Var.size_,&local_78);
    iVar4 = (*(parent->super_IRNode)._vptr_IRNode[7])(parent);
    (this->super_VarSlice).var_high_ = iVar4 - 1;
    (this->super_VarSlice).var_low_ = 0;
    if (parent->width_param_ != (Var *)0x0) {
      uVar8 = Simulator::static_evaluate_expr(parent->width_param_);
      uVar5 = (uint32_t)uVar8;
      goto LAB_003cf1b7;
    }
    uVar6 = (*(parent->super_IRNode)._vptr_IRNode[7])(parent);
  }
  else {
    (this->super_VarSlice).super_Var.var_width_ = parent->var_width_;
    iVar4 = (*(parent->super_IRNode)._vptr_IRNode[0x18])(parent);
    (this->super_VarSlice).super_Var.is_packed_ = SUB41(iVar4,0);
    puVar1 = (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    __last._M_current =
         (parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((ulong)((long)__last._M_current - (long)puVar1) < 5) {
      local_78._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_78._M_impl.super__Vector_impl_data._M_start._4_4_,1);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                 &(this->super_VarSlice).super_Var.size_);
    }
    else {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )(puVar1 + 1),__last,(allocator_type *)&local_a0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                (&(this->super_VarSlice).super_Var.size_);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
    }
    uVar5 = (*(parent->super_IRNode)._vptr_IRNode[0x25])(parent);
    (this->super_VarSlice).var_high_ = uVar5;
    uVar5 = (*(parent->super_IRNode)._vptr_IRNode[0x26])(parent);
    (this->super_VarSlice).var_low_ = uVar5;
    pVVar7 = Var::get_size_param(parent,0);
    if (pVVar7 == (Var *)0x0) {
      uVar6 = *(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      pVVar7 = Var::get_size_param(parent,0);
      uVar8 = Simulator::static_evaluate_expr(pVVar7);
      uVar6 = (uint)uVar8;
    }
  }
  uVar5 = clog2(uVar6);
LAB_003cf1b7:
  var = &this->sliced_var_;
  uVar6 = (*((*var)->super_IRNode)._vptr_IRNode[7])();
  if (uVar6 <= uVar5) {
    return;
  }
  bVar3 = IterVar::has_iter_var(*var);
  if ((bVar3) && (bVar3 = IterVar::safe_to_resize(*var,uVar5,false), bVar3)) {
    IterVar::fix_width(var,uVar5);
    uVar6 = (*((*var)->super_IRNode)._vptr_IRNode[7])();
    if (uVar5 == uVar6) {
      return;
    }
  }
  IterVar::safe_to_resize(*var,uVar5,false);
  local_40 = (VarException *)__cxa_allocate_exception(0x10);
  local_80 = (ulong)*(parent->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (*((*var)->super_IRNode)._vptr_IRNode[7])();
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)((int)local_80 - 1);
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(ulong)uVar5;
  local_58 = (ulong)uVar6;
  bVar9 = fmt::v7::to_string_view<char,_0>
                    ("Bit extraction of array[{0}:0] requires {1} bit index, not {2} bits.");
  format_str.data_ = (char *)bVar9.size_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  format_str.size_ = 0x222;
  fmt::v7::detail::vformat_abi_cxx11_(&local_a0,(detail *)bVar9.data_,format_str,args);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_b0;
  local_b0 = parent;
  local_a8 = slice;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)&local_78,
             __l,&local_31);
  pVVar2 = local_40;
  VarException::VarException
            (local_40,&local_a0,
             (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)&local_78);
  __cxa_throw(pVVar2,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

VarVarSlice::VarVarSlice(kratos::Var *parent, kratos::Var *slice)
    : VarSlice(parent, 0, 0), sliced_var_(slice) {
    // check the size or width
    // we need to re-compute var_high, var_low, width, and other stuff by ourselves here
    // there is an issue about the var_high and var_low; the problem will only show up during
    // the connectivity check
    // TODO: fix this
    uint32_t required_width;
    if (parent->size().size() == 1 && parent->size().front() == 1 && !parent->explicit_array()) {
        // slice through the 1D array
        // so the width will be 1
        var_width_ = 1;
        size_ = {1};
        // potentially cover all the bits
        var_high_ = parent->width() - 1;
        var_low_ = 0;
        if (parent->width_param())
            required_width = Simulator::static_evaluate_expr(parent->width_param());
        else
            required_width = clog2(parent->width());
    } else {
        var_width_ = parent->var_width();
        is_packed_ = parent->is_packed();
        // peel one layer
        if (parent->size().size() > 1)
            size_ = std::vector<uint32_t>(parent->size().begin() + 1, parent->size().end());
        else
            size_ = {1};
        var_high_ = parent->var_high();
        var_low_ = parent->var_low();
        // we need to compute the clog2 here
        if (parent->get_size_param(0))
            required_width = clog2(Simulator::static_evaluate_expr(parent->get_size_param(0)));
        else
            required_width = clog2(parent->size().front());
    }
    if (required_width < sliced_var_->width()) {
        // may need to demote the variable if it's a var cast
        bool has_error = true;
        if (IterVar::has_iter_var(sliced_var_)) {
            if (IterVar::safe_to_resize(sliced_var_, required_width, false)) {
                IterVar::fix_width(sliced_var_, required_width);
                has_error = false;
            }
        }
        if (has_error || required_width != sliced_var_->width()) {
            // error message copied from verilator
            IterVar::safe_to_resize(sliced_var_, required_width, false);
            throw VarException(
                ::format("Bit extraction of array[{0}:0] requires {1} bit index, not {2} bits.",
                         parent->size().front() - 1, required_width, sliced_var_->width()),
                {parent, slice});
        }
    }
}